

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadOpcode(BinaryReader *this,Opcode *out_value,char *desc)

{
  Result RVar1;
  Enum EVar2;
  uint uVar3;
  uint uVar4;
  Enum EVar5;
  uint8_t value;
  uint32_t code;
  byte local_2d;
  uint local_2c;
  
  local_2d = 0;
  RVar1 = ReadU8(this,&local_2d,desc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    uVar3 = (uint)local_2d;
    if ((byte)(local_2d + 4) < 3) {
      RVar1 = ReadU32Leb128(this,&local_2c,desc);
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      uVar4 = 0x1ff;
      if (local_2c < 0x1ff) {
        uVar4 = local_2c;
      }
      uVar4 = uVar3 << 9 | uVar4;
      EVar5 = WabtOpcodeCodeTable[uVar4];
      if (((local_2c != 0) && (EVar5 == Unreachable)) && (EVar5 = -uVar4, EVar5 < Invalid)) {
LAB_001587ee:
        __assert_fail("result >= Invalid",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/opcode.h"
                      ,0x83,"static Enum wabt::Opcode::EncodeInvalidOpcode(uint32_t)");
      }
      out_value->enum_ = EVar5;
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
    }
    else {
      EVar5 = WabtOpcodeCodeTable[local_2d];
      if ((uVar3 != 0 && EVar5 == Unreachable) && (EVar5 = -uVar3, EVar5 < Invalid))
      goto LAB_001587ee;
      out_value->enum_ = EVar5;
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadOpcode(Opcode* out_value, const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));

  if (Opcode::IsPrefixByte(value)) {
    uint32_t code;
    CHECK_RESULT(ReadU32Leb128(&code, desc));
    *out_value = Opcode::FromCode(value, code);
  } else {
    *out_value = Opcode::FromCode(value);
  }
  return Result::Ok;
}